

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void spell_dark_vessel(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  bool bVar2;
  OBJ_DATA *pOVar3;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var4;
  bool isNewUrn;
  OBJ_DATA *corpse;
  OBJ_DATA *urn;
  CHAR_DATA *in_stack_fffffffffffffd58;
  OBJ_DATA *in_stack_fffffffffffffd60;
  CHAR_DATA *in_stack_fffffffffffffd68;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_fffffffffffffd70;
  char *pcVar5;
  allocator<char> *in_stack_fffffffffffffd90;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_201;
  string local_200 [12];
  int in_stack_fffffffffffffe0c;
  OBJ_INDEX_DATA *in_stack_fffffffffffffe10;
  allocator<char> local_1d9;
  string local_1d8 [36];
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined8 local_1a8;
  allocator<char> local_199;
  string local_198 [32];
  char_data **in_stack_fffffffffffffe88;
  _func_void_char_data_ptr_obj_data_ptr *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  string *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeac;
  CQueue *in_stack_fffffffffffffeb0;
  string local_148 [8];
  obj_data **in_stack_fffffffffffffec0;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [16];
  char (*in_stack_ffffffffffffff18) [63];
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
  *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  CQueue *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff50;
  undefined4 uVar6;
  CHAR_DATA *args;
  CHAR_DATA *args_3;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff90;
  void **in_stack_ffffffffffffff98;
  void **in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  DESCRIPTOR_DATA *local_28;
  
  local_28 = (DESCRIPTOR_DATA *)find_urn(in_RDX);
  pOVar3 = get_obj_here(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
  if ((local_28 == (DESCRIPTOR_DATA *)0x0) ||
     (*(int *)(local_28->inbuf + 0xf3) < (int)pOVar3->level)) {
    if ((pOVar3 == (OBJ_DATA *)0x0) || (bVar2 = str_cmp(target_name,""), !bVar2)) {
      send_to_char((char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    else if (((pOVar3->item_type == 0x18) || (pOVar3->item_type == 0x17)) &&
            (uVar1 = pOVar3->wear_flags[0], _Var4 = std::pow<int,int>(0,0x6c4e12),
            (uVar1 & (long)_Var4) == 0)) {
      if ((int)pOVar3->level < in_RDX->level + -9) {
        send_to_char((char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      else {
        bVar2 = false;
        if (local_28 == (DESCRIPTOR_DATA *)0x0) {
          get_obj_index((int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          local_28 = (DESCRIPTOR_DATA *)
                     create_object(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          if (local_28 == (DESCRIPTOR_DATA *)0x0) {
            return;
          }
          bVar2 = true;
        }
        *(short *)(local_28->inbuf + 0xd3) = in_RDX->level;
        *(int *)(local_28->inbuf + 0xf3) = (int)pOVar3->level;
        if (bVar2) {
          *(int *)(local_28->inbuf + 0xf7) = 0;
          obj_to_char(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        }
        _Var4 = std::pow<int,int>(0,0x6c4f46);
        pOVar3->wear_flags[1] = pOVar3->wear_flags[1] | (long)_Var4;
        _Var4 = std::pow<int,int>(0,0x6c4f71);
        pOVar3->wear_flags[0] = pOVar3->wear_flags[0] & ~(long)_Var4;
        WAIT_STATE(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        act((char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
            in_stack_fffffffffffffd58,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        args_3 = (CHAR_DATA *)0x0;
        args = (CHAR_DATA *)0x0;
        uVar6 = 0;
        pcVar5 = &stack0xffffffffffffff54;
        ch_00 = (CHAR_DATA *)&stack0xffffffffffffff58;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   (char (*) [57])in_stack_ffffffffffffff18,
                   (char_data **)(ulong)in_stack_ffffffffffffff50,(void **)0x0,(void **)0x0,
                   (int *)in_stack_ffffffffffffff68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
        send_to_char(pcVar5,ch_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        CQueue::AddToQueue<void(*)(char_data*,obj_data*),char_data*&,obj_data*&>
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffec0);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator(&local_f9);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffeb7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[173],char_data*&>
                    ((CQueue *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     (string *)in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68,
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
                      *)args_3,(char (*) [173])args,&in_stack_ffffffffffffff90->next);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
          std::__cxx11::string::~string(local_120);
          std::allocator<char>::~allocator(&local_121);
          pcVar5 = &stack0xfffffffffffffe8f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,in_stack_fffffffffffffd90);
          __a = &local_199;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
          local_1a8 = 0;
          local_1b0 = 0;
          local_1b4 = 0;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[121],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    ((CQueue *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                     (string *)in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68,
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
                      *)args_3,(char (*) [121])args,&in_stack_ffffffffffffff90->next,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator(&local_199);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[63],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (char_data **)CONCAT44(uVar6,in_stack_ffffffffffffff50),&args->next,
                     &args_3->next,(int *)in_stack_ffffffffffffff68);
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator(&local_201);
          std::__cxx11::string::~string(local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
        }
      }
    }
    else {
      send_to_char((char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
  }
  else {
    send_to_char((char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  return;
}

Assistant:

void spell_dark_vessel(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *urn, *corpse;

	urn = find_urn(ch);
	corpse = get_obj_here(ch, target_name);
	
	if (urn != nullptr && urn->value[3] >= corpse->level)
	{
		send_to_char("You already have a dark vessel in your possession.\n\r", ch);
		return;	
	}


	if (!corpse || !str_cmp(target_name, ""))
	{
		send_to_char("You fail to select a corpse and waste your dark energies.\n\r", ch);
		return;
	}

	if ((corpse->item_type != ITEM_CORPSE_PC && corpse->item_type != ITEM_CORPSE_NPC)
		|| IS_SET(corpse->wear_flags, CORPSE_NO_ANIMATE))
	{
		send_to_char("That wouldn't be a suitable dark vessel.\n\r", ch);
		return;
	}

	if (corpse->level < (ch->level - 9))
	{
		send_to_char("That corpse isn't powerful enough to contain your dark energies.\n\r", ch);
		return;
	}

	bool isNewUrn = false;
	if(urn == nullptr)
	{
		urn = create_object(get_obj_index(OBJ_VNUM_URN), 0);
		if (!urn) // something went wrong, stop the creation
			return;
		
		isNewUrn = true;
	}


	urn->level = ch->level;
	urn->value[3] = corpse->level;

	if(isNewUrn)
	{
		urn->value[4] = 0;
		obj_to_char(urn, ch);
	}

	SET_BIT(corpse->wear_flags, ITEM_NO_SAC);
	REMOVE_BIT(corpse->wear_flags, ITEM_TAKE);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);

	act("$n plunges a hand into $p's chest cavity, and removes the heart.", ch, corpse, 0, TO_ROOM);

	RS.Queue.AddToQueue(2, "spell_dark_vessel", "act_queue", act_queue, "$n holds the heart aloft as it visibly begins to harden.", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You remove the corpse's heart and squeeze the blood out of it, hardening it into a solid object.\n\r", ch);

	RS.Queue.AddToQueue(4, "spell_dark_vessel", "make_urn", make_urn, ch, corpse);
	
	if(isNewUrn == false)
	{
		RS.Queue.AddToQueue(6, "spell_dark_vessel", "send_to_char_queue", send_to_char_queue, "You drink the remaining blood from your old vessel, expelling each drop into the new one as your body convulses!\n\r The old vessel drops from your hand as it turns to ash.\n\r", ch);
		RS.Queue.AddToQueue(7, "spell_dark_vessel", "act_queue", act_queue, "$n drinks a thick fluid from a sanguine object and begins convulsing as they expel the fluid into the newly made vessel!", ch, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "spell_dark_vessel", "act_queue", act_queue, "$n shudders, releasing the sanguine object as it turns to ash.", ch, nullptr, nullptr, TO_ROOM);
	}
}